

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O1

void __thiscall
vo::ManagedImage<unsigned_short,_std::allocator<unsigned_short>_>::~ManagedImage
          (ManagedImage<unsigned_short,_std::allocator<unsigned_short>_> *this)

{
  unsigned_short *puVar1;
  
  puVar1 = (this->super_Image<unsigned_short>).ptr;
  if (puVar1 != (unsigned_short *)0x0) {
    operator_delete(puVar1,(this->super_Image<unsigned_short>).pitch *
                           (this->super_Image<unsigned_short>).h & 0xfffffffffffffffe);
    (this->super_Image<unsigned_short>).ptr = (unsigned_short *)0x0;
  }
  return;
}

Assistant:

inline ~ManagedImage() { Deallocate(); }